

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::track_expression_read(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  Types TVar2;
  uint32_t uVar3;
  Variant *this_00;
  SPIRExpression *pSVar4;
  SPIRAccessChain *pSVar5;
  mapped_type *pmVar6;
  mapped_type *v;
  TypedID<(spirv_cross::Types)0> *pTStack_60;
  TypedID<(spirv_cross::Types)0> implied_read_1;
  TypedID<(spirv_cross::Types)0> *__end2_1;
  TypedID<(spirv_cross::Types)0> *__begin2_1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *__range2_1;
  SPIRAccessChain *e_1;
  TypedID<(spirv_cross::Types)0> *pTStack_38;
  TypedID<(spirv_cross::Types)0> implied_read;
  TypedID<(spirv_cross::Types)0> *__end2;
  TypedID<(spirv_cross::Types)0> *__begin2;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *__range2;
  SPIRExpression *e;
  CompilerGLSL *pCStack_10;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  e._4_4_ = id;
  pCStack_10 = this;
  this_00 = VectorView<spirv_cross::Variant>::operator[]
                      (&(this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>,
                       (ulong)id);
  TVar2 = Variant::get_type(this_00);
  if (TVar2 == TypeExpression) {
    pSVar4 = Compiler::get<spirv_cross::SPIRExpression>(&this->super_Compiler,e._4_4_);
    __end2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::begin
                       (&(pSVar4->implied_read_expressions).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
    pTStack_38 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::end
                           (&(pSVar4->implied_read_expressions).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
    for (; __end2 != pTStack_38; __end2 = __end2 + 1) {
      e_1._4_4_ = __end2->id;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&e_1 + 4));
      track_expression_read(this,uVar3);
    }
  }
  else if (TVar2 == TypeAccessChain) {
    pSVar5 = Compiler::get<spirv_cross::SPIRAccessChain>(&this->super_Compiler,e._4_4_);
    __end2_1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::begin
                         (&(pSVar5->implied_read_expressions).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
    pTStack_60 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::end
                           (&(pSVar5->implied_read_expressions).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
    for (; __end2_1 != pTStack_60; __end2_1 = __end2_1 + 1) {
      v._4_4_ = __end2_1->id;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&v + 4));
      track_expression_read(this,uVar3);
    }
  }
  bVar1 = expression_is_forwarded(this,e._4_4_);
  if ((bVar1) && (bVar1 = expression_suppresses_usage_tracking(this,e._4_4_), !bVar1)) {
    pmVar6 = ::std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->expression_usage_counts,(key_type *)((long)&e + 4));
    *pmVar6 = *pmVar6 + 1;
    bVar1 = expression_read_implies_multiple_reads(this,e._4_4_);
    if (bVar1) {
      *pmVar6 = *pmVar6 + 1;
    }
    if (1 < *pmVar6) {
      force_temporary_and_recompile(this,e._4_4_);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::track_expression_read(uint32_t id)
{
	switch (ir.ids[id].get_type())
	{
	case TypeExpression:
	{
		auto &e = get<SPIRExpression>(id);
		for (auto implied_read : e.implied_read_expressions)
			track_expression_read(implied_read);
		break;
	}

	case TypeAccessChain:
	{
		auto &e = get<SPIRAccessChain>(id);
		for (auto implied_read : e.implied_read_expressions)
			track_expression_read(implied_read);
		break;
	}

	default:
		break;
	}

	// If we try to read a forwarded temporary more than once we will stamp out possibly complex code twice.
	// In this case, it's better to just bind the complex expression to the temporary and read that temporary twice.
	if (expression_is_forwarded(id) && !expression_suppresses_usage_tracking(id))
	{
		auto &v = expression_usage_counts[id];
		v++;

		// If we create an expression outside a loop,
		// but access it inside a loop, we're implicitly reading it multiple times.
		// If the expression in question is expensive, we should hoist it out to avoid relying on loop-invariant code motion
		// working inside the backend compiler.
		if (expression_read_implies_multiple_reads(id))
			v++;

		if (v >= 2)
		{
			//if (v == 2)
			//    fprintf(stderr, "ID %u was forced to temporary due to more than 1 expression use!\n", id);

			// Force a recompile after this pass to avoid forwarding this variable.
			force_temporary_and_recompile(id);
		}
	}
}